

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

__m256i * highbd_get_recon_8x8_avx2(__m256i pred,__m256i res,int bd)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i u;
  __m256i *palVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_YMM1_H;
  undefined8 in_register_00001258;
  __m256i x0;
  undefined8 local_140;
  undefined8 uStackY_138;
  undefined8 uStackY_130;
  undefined4 uStackY_90;
  int bd_00;
  
  uStackY_90 = (undefined4)in_YMM1_H;
  bd_00 = (int)((ulong)in_YMM1_H >> 0x20);
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = in_XMM1_Qa;
  auVar2._16_4_ = uStackY_90;
  auVar2._20_4_ = bd_00;
  auVar2._24_8_ = in_register_00001258;
  auVar1._8_8_ = in_XMM0_Qa;
  auVar1._0_8_ = in_XMM0_Qa;
  auVar1._16_8_ = in_XMM0_Qa;
  auVar1._24_8_ = in_XMM0_Qa;
  auVar1 = vpaddd_avx2(auVar2,auVar1);
  local_140 = auVar1._0_8_;
  uStackY_138 = auVar1._8_8_;
  uStackY_130 = auVar1._16_8_;
  auVar1 = vpackusdw_avx2(auVar1,auVar1);
  vpermq_avx2(auVar1,0xd8);
  u[1] = local_140;
  u[0] = in_register_00001258;
  u[2] = uStackY_138;
  u[3] = uStackY_130;
  palVar3 = highbd_clamp_epi16_avx2(u,bd_00);
  return palVar3;
}

Assistant:

static inline __m256i highbd_get_recon_8x8_avx2(const __m256i pred, __m256i res,
                                                const int bd) {
  __m256i x0 = pred;
  x0 = _mm256_add_epi32(res, x0);
  x0 = _mm256_packus_epi32(x0, x0);
  x0 = _mm256_permute4x64_epi64(x0, 0xd8);
  x0 = highbd_clamp_epi16_avx2(x0, bd);
  return x0;
}